

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderRectFilledWithHole
               (ImDrawList *draw_list,ImRect *outer,ImRect *inner,ImU32 col,float rounding)

{
  float fVar1;
  float *in_RDX;
  float *in_RSI;
  ImDrawList *in_RDI;
  bool fill_D;
  bool fill_U;
  bool fill_R;
  bool fill_L;
  undefined8 in_stack_ffffffffffffff20;
  ImDrawFlags flags;
  ImDrawList *in_stack_ffffffffffffff28;
  ImDrawList *in_stack_ffffffffffffff30;
  ImDrawList *in_stack_ffffffffffffff38;
  ImDrawList *in_stack_ffffffffffffff40;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImVec2 local_2c;
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  float *local_18;
  float *local_10;
  undefined8 local_8;
  
  flags = (ImDrawFlags)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  fVar1 = *in_RDX;
  local_21 = *in_RSI <= fVar1 && fVar1 != *in_RSI;
  local_22 = in_RDX[2] < in_RSI[2];
  local_23 = in_RSI[1] <= in_RDX[1] && in_RDX[1] != in_RSI[1];
  local_24 = in_RDX[3] < in_RSI[3];
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*in_RSI <= fVar1 && fVar1 != *in_RSI) {
    ImVec2::ImVec2(&local_2c,*in_RSI,in_RDX[1]);
    ImVec2::ImVec2(&local_34,*local_18,local_18[3]);
    ImDrawList::AddRectFilled
              (in_stack_ffffffffffffff40,(ImVec2 *)in_stack_ffffffffffffff38,
               (ImVec2 *)in_stack_ffffffffffffff30,(ImU32)((ulong)in_stack_ffffffffffffff28 >> 0x20)
               ,SUB84(in_stack_ffffffffffffff28,0),flags);
  }
  if ((local_22 & 1) != 0) {
    ImVec2::ImVec2(&local_3c,local_18[2],local_18[1]);
    ImVec2::ImVec2(&local_44,local_10[2],local_18[3]);
    ImDrawList::AddRectFilled
              (in_stack_ffffffffffffff40,(ImVec2 *)in_stack_ffffffffffffff38,
               (ImVec2 *)in_stack_ffffffffffffff30,(ImU32)((ulong)in_stack_ffffffffffffff28 >> 0x20)
               ,SUB84(in_stack_ffffffffffffff28,0),flags);
  }
  if ((local_23 & 1) != 0) {
    in_stack_ffffffffffffff40 = local_8;
    ImVec2::ImVec2(&local_4c,*local_18,local_10[1]);
    ImVec2::ImVec2(&local_54,local_18[2],local_18[1]);
    ImDrawList::AddRectFilled
              (in_stack_ffffffffffffff40,(ImVec2 *)in_stack_ffffffffffffff38,
               (ImVec2 *)in_stack_ffffffffffffff30,(ImU32)((ulong)in_stack_ffffffffffffff28 >> 0x20)
               ,SUB84(in_stack_ffffffffffffff28,0),flags);
  }
  if ((local_24 & 1) != 0) {
    in_stack_ffffffffffffff38 = local_8;
    ImVec2::ImVec2(&local_5c,*local_18,local_18[3]);
    ImVec2::ImVec2(&local_64,local_18[2],local_10[3]);
    ImDrawList::AddRectFilled
              (in_stack_ffffffffffffff40,(ImVec2 *)in_stack_ffffffffffffff38,
               (ImVec2 *)in_stack_ffffffffffffff30,(ImU32)((ulong)in_stack_ffffffffffffff28 >> 0x20)
               ,SUB84(in_stack_ffffffffffffff28,0),flags);
  }
  if (((local_21 & 1) != 0) && ((local_23 & 1) != 0)) {
    in_stack_ffffffffffffff30 = local_8;
    ImVec2::ImVec2(&local_6c,*local_10,local_10[1]);
    ImVec2::ImVec2(&local_74,*local_18,local_18[1]);
    ImDrawList::AddRectFilled
              (in_stack_ffffffffffffff40,(ImVec2 *)in_stack_ffffffffffffff38,
               (ImVec2 *)in_stack_ffffffffffffff30,(ImU32)((ulong)in_stack_ffffffffffffff28 >> 0x20)
               ,SUB84(in_stack_ffffffffffffff28,0),flags);
  }
  if (((local_22 & 1) != 0) && ((local_23 & 1) != 0)) {
    in_stack_ffffffffffffff28 = local_8;
    ImVec2::ImVec2(&local_7c,local_18[2],local_10[1]);
    ImVec2::ImVec2(&local_84,local_10[2],local_18[1]);
    ImDrawList::AddRectFilled
              (in_stack_ffffffffffffff40,(ImVec2 *)in_stack_ffffffffffffff38,
               (ImVec2 *)in_stack_ffffffffffffff30,(ImU32)((ulong)in_stack_ffffffffffffff28 >> 0x20)
               ,SUB84(in_stack_ffffffffffffff28,0),flags);
  }
  if (((local_21 & 1) != 0) && ((local_24 & 1) != 0)) {
    ImVec2::ImVec2(&local_8c,*local_10,local_18[3]);
    ImVec2::ImVec2(&local_94,*local_18,local_10[3]);
    ImDrawList::AddRectFilled
              (in_stack_ffffffffffffff40,(ImVec2 *)in_stack_ffffffffffffff38,
               (ImVec2 *)in_stack_ffffffffffffff30,(ImU32)((ulong)in_stack_ffffffffffffff28 >> 0x20)
               ,SUB84(in_stack_ffffffffffffff28,0),local_8._4_4_);
    flags = local_8._4_4_;
  }
  if (((local_22 & 1) != 0) && ((local_24 & 1) != 0)) {
    ImVec2::ImVec2(&local_9c,local_18[2],local_18[3]);
    ImVec2::ImVec2(&local_a4,local_10[2],local_10[3]);
    ImDrawList::AddRectFilled
              (in_stack_ffffffffffffff40,(ImVec2 *)in_stack_ffffffffffffff38,
               (ImVec2 *)in_stack_ffffffffffffff30,(ImU32)((ulong)in_stack_ffffffffffffff28 >> 0x20)
               ,SUB84(in_stack_ffffffffffffff28,0),flags);
  }
  return;
}

Assistant:

void ImGui::RenderRectFilledWithHole(ImDrawList* draw_list, const ImRect& outer, const ImRect& inner, ImU32 col, float rounding)
{
    const bool fill_L = (inner.Min.x > outer.Min.x);
    const bool fill_R = (inner.Max.x < outer.Max.x);
    const bool fill_U = (inner.Min.y > outer.Min.y);
    const bool fill_D = (inner.Max.y < outer.Max.y);
    if (fill_L) draw_list->AddRectFilled(ImVec2(outer.Min.x, inner.Min.y), ImVec2(inner.Min.x, inner.Max.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_U ? 0 : ImDrawFlags_RoundCornersTopLeft)    | (fill_D ? 0 : ImDrawFlags_RoundCornersBottomLeft));
    if (fill_R) draw_list->AddRectFilled(ImVec2(inner.Max.x, inner.Min.y), ImVec2(outer.Max.x, inner.Max.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_U ? 0 : ImDrawFlags_RoundCornersTopRight)   | (fill_D ? 0 : ImDrawFlags_RoundCornersBottomRight));
    if (fill_U) draw_list->AddRectFilled(ImVec2(inner.Min.x, outer.Min.y), ImVec2(inner.Max.x, inner.Min.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_L ? 0 : ImDrawFlags_RoundCornersTopLeft)    | (fill_R ? 0 : ImDrawFlags_RoundCornersTopRight));
    if (fill_D) draw_list->AddRectFilled(ImVec2(inner.Min.x, inner.Max.y), ImVec2(inner.Max.x, outer.Max.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_L ? 0 : ImDrawFlags_RoundCornersBottomLeft) | (fill_R ? 0 : ImDrawFlags_RoundCornersBottomRight));
    if (fill_L && fill_U) draw_list->AddRectFilled(ImVec2(outer.Min.x, outer.Min.y), ImVec2(inner.Min.x, inner.Min.y), col, rounding, ImDrawFlags_RoundCornersTopLeft);
    if (fill_R && fill_U) draw_list->AddRectFilled(ImVec2(inner.Max.x, outer.Min.y), ImVec2(outer.Max.x, inner.Min.y), col, rounding, ImDrawFlags_RoundCornersTopRight);
    if (fill_L && fill_D) draw_list->AddRectFilled(ImVec2(outer.Min.x, inner.Max.y), ImVec2(inner.Min.x, outer.Max.y), col, rounding, ImDrawFlags_RoundCornersBottomLeft);
    if (fill_R && fill_D) draw_list->AddRectFilled(ImVec2(inner.Max.x, inner.Max.y), ImVec2(outer.Max.x, outer.Max.y), col, rounding, ImDrawFlags_RoundCornersBottomRight);
}